

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::multiply_zero_padded(bool add_to,tensor *dest,tensor *src1,tensor *src2)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  size_t sVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  tensor *in_RCX;
  tensor *in_RDX;
  tensor *in_RSI;
  byte in_DIL;
  longlong s_idx_1;
  longlong s_idx;
  float v2;
  float v1;
  long c;
  long r;
  long k;
  long n;
  size_t i_1;
  size_t i;
  float *s2;
  float *s1;
  float *d;
  tensor *in_stack_fffffffffffffef8;
  long lVar10;
  tensor *in_stack_ffffffffffffff00;
  float local_70;
  float local_6c;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  float *local_28;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*in_RSI->_vptr_tensor[3])();
  local_28 = (float *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*in_RDX->_vptr_tensor[2])();
  lVar4 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*in_RCX->_vptr_tensor[2])();
  lVar5 = CONCAT44(extraout_var_01,iVar3);
  bVar2 = have_same_dimensions(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if ((bVar2) &&
     (bVar2 = have_same_dimensions(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8), bVar2)) {
    if ((in_DIL & 1) == 0) {
      for (local_48 = 0; sVar6 = tensor::size(in_RSI), local_48 < sVar6; local_48 = local_48 + 1) {
        local_28[local_48] = *(float *)(lVar4 + local_48 * 4) * *(float *)(lVar5 + local_48 * 4);
      }
    }
    else {
      for (local_40 = 0; sVar6 = tensor::size(in_RSI), local_40 < sVar6; local_40 = local_40 + 1) {
        auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar5 + local_40 * 4)),
                                 ZEXT416(*(uint *)(lVar4 + local_40 * 4)),
                                 ZEXT416((uint)local_28[local_40]));
        local_28[local_40] = auVar1._0_4_;
      }
    }
  }
  else {
    for (local_50 = 0; lVar7 = tensor::num_samples(in_RSI), local_50 < lVar7;
        local_50 = local_50 + 1) {
      for (local_58 = 0; lVar7 = tensor::k(in_RSI), local_58 < lVar7; local_58 = local_58 + 1) {
        for (local_60 = 0; lVar7 = tensor::nr(in_RSI), local_60 < lVar7; local_60 = local_60 + 1) {
          for (local_68 = 0; lVar7 = tensor::nc(in_RSI), local_68 < lVar7; local_68 = local_68 + 1)
          {
            local_6c = 0.0;
            local_70 = 0.0;
            lVar7 = tensor::num_samples(in_RDX);
            if ((((local_50 < lVar7) && (lVar7 = tensor::k(in_RDX), local_58 < lVar7)) &&
                (lVar7 = tensor::nr(in_RDX), local_60 < lVar7)) &&
               (lVar7 = tensor::nc(in_RDX), local_68 < lVar7)) {
              lVar7 = tensor::k(in_RDX);
              lVar8 = tensor::nr(in_RDX);
              lVar9 = tensor::nc(in_RDX);
              local_6c = *(float *)(lVar4 + (((local_50 * lVar7 + local_58) * lVar8 + local_60) *
                                             lVar9 + local_68) * 4);
            }
            lVar7 = tensor::num_samples(in_RCX);
            if (((local_50 < lVar7) && (lVar7 = tensor::k(in_RCX), local_58 < lVar7)) &&
               ((lVar10 = local_60, lVar7 = tensor::nr(in_RCX), lVar10 < lVar7 &&
                (lVar10 = local_68, lVar7 = tensor::nc(in_RCX), lVar10 < lVar7)))) {
              lVar7 = tensor::k(in_RCX);
              lVar8 = tensor::nr(in_RCX);
              lVar9 = tensor::nc(in_RCX);
              local_70 = *(float *)(lVar5 + (((local_50 * lVar7 + local_58) * lVar8 + local_60) *
                                             lVar9 + local_68) * 4);
            }
            if ((in_DIL & 1) == 0) {
              *local_28 = local_6c * local_70;
            }
            else {
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_70),ZEXT416((uint)local_6c),
                                       ZEXT416((uint)*local_28));
              *local_28 = auVar1._0_4_;
            }
            local_28 = local_28 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void multiply_zero_padded (
            bool add_to,
            tensor& dest,
            const tensor& src1,
            const tensor& src2
        )
        {
            auto d = dest.host();
            auto s1 = src1.host();
            auto s2 = src2.host();

            // Do the simple and fast version if everything has the same dimensions
            if (have_same_dimensions(dest, src1) &&
                have_same_dimensions(dest, src2))
            {
                if (add_to)
                {
                    for (size_t i = 0; i < dest.size(); ++i)
                        d[i] += s1[i] * s2[i];
                }
                else
                {
                    for (size_t i = 0; i < dest.size(); ++i)
                        d[i] = s1[i] * s2[i];
                }
                return;
            }

            // Otherwise, do the more complex version with bounds checking.
            for (long n = 0; n < dest.num_samples(); ++n)
            {
                for (long k = 0; k < dest.k(); ++k)
                {
                    for (long r = 0; r < dest.nr(); ++r)
                    {
                        for (long c = 0; c < dest.nc(); ++c)
                        {
                            float v1 = 0;
                            float v2 = 0;

                            // if this index is inside src1
                            if (n < src1.num_samples() && 
                                k < src1.k() && 
                                r < src1.nr() && 
                                c < src1.nc() )
                            {
                                const auto s_idx = ((n*src1.k() + k)*src1.nr() + r)*src1.nc() + c;
                                v1 = s1[s_idx];
                            }

                            // if this index is inside src2
                            if (n < src2.num_samples() && 
                                k < src2.k() && 
                                r < src2.nr() && 
                                c < src2.nc() )
                            {
                                const auto s_idx = ((n*src2.k() + k)*src2.nr() + r)*src2.nc() + c;
                                v2 = s2[s_idx];
                            }

                            if (add_to)
                                *d += v1 * v2;
                            else
                                *d = v1 * v2;
                            ++d;
                        }
                    }
                }
            }
        }